

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<long_double>_>::AddKel
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *elmat
          ,TPZVec<long> *source,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  longdouble lVar9;
  longdouble lVar10;
  complex<long_double> prevval;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined4 uStack_9c;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  TPZMatrix<std::complex<long_double>_> *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar6 = source->fNElements;
  lVar9 = (longdouble)0;
  local_b8 = SUB104(lVar9,0);
  uStack_b4 = (undefined4)((unkuint10)lVar9 >> 0x20);
  uStack_b0 = (undefined2)((unkuint10)lVar9 >> 0x40);
  local_a8 = local_b8;
  uStack_a4 = uStack_b4;
  uStack_a0 = uStack_b0;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_70 = lVar6;
  if (iVar3 == 0) {
    if (0 < lVar6) {
      local_68 = 0;
      do {
        lVar6 = destinationindex->fStore[local_68];
        local_88 = source->fStore[local_68];
        local_90 = local_88 << 5;
        lVar7 = 0;
        local_80 = lVar6;
        do {
          lVar4 = local_88;
          bVar8 = local_88 < 0;
          local_78 = destinationindex->fStore[lVar7];
          lVar1 = source->fStore[lVar7];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_58,this,lVar6);
          lVar6 = local_80;
          local_a8 = local_48;
          uStack_a4 = uStack_44;
          uStack_a0 = (undefined2)uStack_40;
          uStack_9e = (undefined2)((uint)uStack_40 >> 0x10);
          uStack_9c = uStack_3c;
          local_b8 = local_58;
          uStack_b4 = uStack_54;
          uStack_b0 = (undefined2)uStack_50;
          uStack_ae = (undefined2)((uint)uStack_50 >> 0x10);
          uStack_ac = uStack_4c;
          lVar5 = (elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
          if (((lVar5 <= lVar4 || bVar8) || (lVar1 < 0)) ||
             ((elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar1
             )) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = lVar5 * lVar1;
          lVar10 = (longdouble)CONCAT28(uStack_b0,CONCAT44(uStack_54,local_58)) +
                   *(longdouble *)(elmat->fElem[lVar5]._M_value + local_90);
          lVar9 = (longdouble)CONCAT28(uStack_a0,CONCAT44(uStack_44,local_48)) +
                  *(longdouble *)(elmat->fElem[lVar5]._M_value + local_90 + 0x10);
          local_b8 = SUB104(lVar10,0);
          uStack_b4 = (undefined4)((unkuint10)lVar10 >> 0x20);
          uStack_b0 = (undefined2)((unkuint10)lVar10 >> 0x40);
          local_a8 = SUB104(lVar9,0);
          uStack_a4 = (undefined4)((unkuint10)lVar9 >> 0x20);
          uStack_a0 = (undefined2)((unkuint10)lVar9 >> 0x40);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,local_80,local_78,&local_b8);
          lVar7 = lVar7 + 1;
        } while (local_70 != lVar7);
        local_68 = local_68 + 1;
      } while (local_68 != local_70);
    }
  }
  else if (0 < lVar6) {
    lVar6 = 0;
    local_60 = this;
    do {
      lVar7 = destinationindex->fStore[lVar6];
      local_80 = source->fStore[lVar6];
      local_88 = local_80 << 5;
      local_90 = lVar6;
      local_78 = lVar7;
      do {
        lVar2 = local_80;
        bVar8 = local_80 < 0;
        lVar1 = destinationindex->fStore[lVar6];
        lVar5 = source->fStore[lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_58,this,lVar7,lVar1);
        this = local_60;
        lVar7 = local_78;
        local_a8 = local_48;
        uStack_a4 = uStack_44;
        uStack_a0 = (undefined2)uStack_40;
        uStack_9e = (undefined2)((uint)uStack_40 >> 0x10);
        uStack_9c = uStack_3c;
        local_b8 = local_58;
        uStack_b4 = uStack_54;
        uStack_b0 = (undefined2)uStack_50;
        uStack_ae = (undefined2)((uint)uStack_50 >> 0x10);
        uStack_ac = uStack_4c;
        lVar4 = (elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
        if (((lVar4 <= lVar2 || bVar8) || (lVar5 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar5))
        {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar4 = lVar4 * lVar5;
        lVar10 = (longdouble)CONCAT28(uStack_b0,CONCAT44(uStack_54,local_58)) +
                 *(longdouble *)(elmat->fElem[lVar4]._M_value + local_88);
        lVar9 = (longdouble)CONCAT28(uStack_a0,CONCAT44(uStack_44,local_48)) +
                *(longdouble *)(elmat->fElem[lVar4]._M_value + local_88 + 0x10);
        local_b8 = SUB104(lVar10,0);
        uStack_b4 = (undefined4)((unkuint10)lVar10 >> 0x20);
        uStack_b0 = (undefined2)((unkuint10)lVar10 >> 0x40);
        local_a8 = SUB104(lVar9,0);
        uStack_a4 = (undefined4)((unkuint10)lVar9 >> 0x20);
        uStack_a0 = (undefined2)((unkuint10)lVar9 >> 0x40);
        (*(local_60->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (local_60,local_78,lVar1,&local_b8);
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_70);
      lVar6 = local_90 + 1;
    } while (lVar6 != local_70);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}